

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int bitstream_w_memcpy(bitstream_w *stream,void *src,size_t bytes)

{
  ulong uVar1;
  
  uVar1 = stream->bit_offset;
  if ((uVar1 & 7) != 0) {
    uVar1 = (uVar1 & 0xfffffffffffffff8) + 8;
    stream->bit_offset = uVar1;
  }
  if (stream->length < (uVar1 >> 3) + bytes) {
    return -1;
  }
  memcpy((void *)((uVar1 >> 3) + (long)stream->ptr),src,bytes);
  return 0;
}

Assistant:

int
bitstream_w_memcpy(struct bitstream_w *stream, const void *src, size_t bytes) {
  size_t offset;
  uint8_t *buffer;

  bitstream_w_pad(stream);
  offset = stream->bit_offset / 8;

  if (offset + bytes > stream->length) {
    return -1;
  }

  buffer = stream->ptr;

  memcpy(&buffer[offset], src, bytes);
  offset += bytes * 8;
  return 0;
}